

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExpressionTree.cpp
# Opt level: O3

TypeBase * ApplyArraySizesToType(ExpressionContext *ctx,TypeBase *type,SynBase *sizes)

{
  ExprBase *pEVar1;
  TypeUnsizedArray *pTVar2;
  TypeBase *pTVar3;
  TypeArray *pTVar4;
  uint uVar5;
  char *pcVar6;
  SynBase *syntax;
  
  syntax = (SynBase *)0x0;
  if ((sizes != (SynBase *)0x0) && (sizes->typeID != 3)) {
    syntax = sizes;
  }
  if (sizes->next != (SynBase *)0x0) {
    type = ApplyArraySizesToType(ctx,type,sizes->next);
  }
  if ((type == (TypeBase *)0x0) || (type->typeID != 0xe)) {
    if (type == ctx->typeVoid) {
      pcVar6 = "ERROR: cannot specify array size for void";
      syntax = sizes;
    }
    else if (syntax == (SynBase *)0x0) {
      if (type->size < 0x10000) {
        pTVar2 = ExpressionContext::GetUnsizedArrayType(ctx,type);
        return (TypeBase *)pTVar2;
      }
      pcVar6 = "ERROR: array element size cannot exceed 65535 bytes";
      syntax = sizes;
    }
    else {
      pEVar1 = AnalyzeExpression(ctx,syntax);
      pEVar1 = CreateCast(ctx,syntax,pEVar1,ctx->typeLong,false);
      pEVar1 = anon_unknown.dwarf_9c70f::EvaluateExpression(ctx,syntax,pEVar1);
      if ((pEVar1 == (ExprBase *)0x0) || (pEVar1->typeID != 6)) {
        pcVar6 = "ERROR: array size cannot be evaluated";
      }
      else if ((long)pEVar1[1]._vptr_ExprBase < 1) {
        pcVar6 = "ERROR: array size can\'t be negative or zero";
      }
      else {
        if ((type != (TypeBase *)0x0) && (type->typeID == 0x18)) {
          if (*(char *)&type[3]._vptr_TypeBase == '\0') {
            uVar5 = *(int *)&(type->name).end - (int)(type->name).begin;
            pcVar6 = "ERROR: type \'%.*s\' is not fully defined";
LAB_00153d6d:
            anon_unknown.dwarf_9c70f::Stop(ctx,syntax,pcVar6,(ulong)uVar5);
          }
          if (*(char *)((long)&type[3]._vptr_TypeBase + 2) == '\x01') {
            uVar5 = *(int *)&(type->name).end - (int)(type->name).begin;
            pcVar6 = 
            "ERROR: class \'%.*s\' implements \'finalize\' so only an unsized array type can be created"
            ;
            goto LAB_00153d6d;
          }
        }
        if (type->size < 0x10000) {
          if (type->typeID == 0x1b) {
            pcVar6 = "ERROR: expected \'.first\'/\'.last\'/\'[N]\'/\'.size\' after \'argument\'";
          }
          else {
            if (type->typeID != 0x1c) {
              pTVar4 = ExpressionContext::GetArrayType(ctx,type,(longlong)pEVar1[1]._vptr_ExprBase);
              return &pTVar4->super_TypeBase;
            }
            pcVar6 = "ERROR: expected \'(\' after \'hasMember\'";
          }
          anon_unknown.dwarf_9c70f::Report(ctx,syntax,pcVar6);
          pTVar3 = &ExpressionContext::GetErrorType(ctx)->super_TypeBase;
          return pTVar3;
        }
        pcVar6 = "ERROR: array element size cannot exceed 65535 bytes";
      }
    }
  }
  else {
    if (syntax == (SynBase *)0x0) {
      return &ctx->typeAutoArray->super_TypeBase;
    }
    pcVar6 = "ERROR: cannot specify array size for auto";
  }
  anon_unknown.dwarf_9c70f::Stop(ctx,syntax,pcVar6);
}

Assistant:

TypeBase* ApplyArraySizesToType(ExpressionContext &ctx, TypeBase *type, SynBase *sizes)
{
	SynBase *size = sizes;

	if(isType<SynNothing>(size))
		size = NULL;

	if(sizes->next)
		type = ApplyArraySizesToType(ctx, type, sizes->next);

	if(isType<TypeAuto>(type))
	{
		if(size)
			Stop(ctx, size, "ERROR: cannot specify array size for auto");

		return ctx.typeAutoArray;
	}

	if(type == ctx.typeVoid)
		Stop(ctx, sizes, "ERROR: cannot specify array size for void");

	if(!size)
	{
		if(type->size >= 64 * 1024)
			Stop(ctx, sizes, "ERROR: array element size cannot exceed 65535 bytes");

		return ctx.GetUnsizedArrayType(type);
	}

	ExprBase *sizeValue = AnalyzeExpression(ctx, size);

	if(ExprIntegerLiteral *number = getType<ExprIntegerLiteral>(EvaluateExpression(ctx, size, CreateCast(ctx, size, sizeValue, ctx.typeLong, false))))
	{
		if(number->value <= 0)
			Stop(ctx, size, "ERROR: array size can't be negative or zero");

		if(TypeClass *typeClass = getType<TypeClass>(type))
		{
			if(!typeClass->completed)
				Stop(ctx, size, "ERROR: type '%.*s' is not fully defined", FMT_ISTR(type->name));

			if(typeClass->hasFinalizer)
				Stop(ctx, size, "ERROR: class '%.*s' implements 'finalize' so only an unsized array type can be created", FMT_ISTR(type->name));
		}

		if(type->size >= 64 * 1024)
			Stop(ctx, size, "ERROR: array element size cannot exceed 65535 bytes");

		if(!AssertResolvableType(ctx, size, type, true))
			return ctx.GetErrorType();

		return ctx.GetArrayType(type, number->value);
	}

	Stop(ctx, size, "ERROR: array size cannot be evaluated");

	return NULL;
}